

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

int32 feat_s2mfc_read_norm_pad
                (feat_t *fcb,char *file,int32 win,int32 sf,int32 ef,mfcc_t ***out_mfc,int32 maxfr,
                int32 cepsize)

{
  mfcc_t **mfc;
  mfcc_t mVar1;
  mfcc_t *pointer;
  mfcc_t **ppmVar2;
  int32 iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  char *fmt;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint nfr;
  ulong uVar14;
  ulong uVar15;
  int32 n_float32;
  FILE *local_108;
  mfcc_t **local_100;
  int local_f4;
  ulong local_f0;
  size_t local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  __off_t local_c8;
  stat statbuf;
  
  if (out_mfc != (mfcc_t ***)0x0) {
    *out_mfc = (mfcc_t **)0x0;
  }
  uVar5 = ef;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,0x3ff,"Reading mfc file: \'%s\'[%d..%d]\n",file,(ulong)(uint)sf,ef);
  if (ef <= sf && -1 < ef) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x401,"%s: End frame (%d) <= Start frame (%d)\n",file,(ulong)(uint)ef,sf);
    return -1;
  }
  iVar3 = stat_retry(file,&statbuf);
  if ((iVar3 < 0) || (__stream = fopen(file,"rb"), __stream == (FILE *)0x0)) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                   ,0x408,"Failed to open file \'%s\' for reading",file);
    return -1;
  }
  local_100 = (mfcc_t **)CONCAT44(local_100._4_4_,win);
  iVar3 = fread_retry(&n_float32,4,1,(FILE *)__stream);
  if (iVar3 != 1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x40e,"%s: fread(#floats) failed\n",file);
    goto LAB_00113c9e;
  }
  uVar6 = (ulong)(uint)n_float32;
  iVar9 = n_float32 * 4 + 4;
  uVar4 = n_float32;
  local_108 = __stream;
  if ((iVar9 == (int)statbuf.st_size) ||
     (uVar4 = (uint)n_float32 >> 0x18 | (n_float32 & 0xff0000U) >> 8 | (n_float32 & 0xff00U) << 8 |
              n_float32 << 0x18, uVar4 * 4 + 4 == (int)statbuf.st_size)) {
    n_float32 = uVar4;
    if (n_float32 < 1) {
      fmt = "%s: Header size field (#floats) = %d\n";
      lVar7 = 0x426;
      uVar6 = (ulong)(uint)n_float32;
    }
    else {
      uVar4 = n_float32 / cepsize;
      if (uVar4 * cepsize != n_float32) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x42f,"Header size field: %d; not multiple of %d\n",(ulong)(uint)n_float32,
                (ulong)(uint)cepsize,uVar5);
        __stream = local_108;
        goto LAB_00113c9e;
      }
      if ((0 < sf) && ((int)uVar4 <= sf)) {
        fmt = "%s: Start frame (%d) beyond file size (%d)\n";
        lVar7 = 0x438;
        uVar6 = (ulong)(uint)sf;
        uVar5 = uVar4;
        goto LAB_00113c70;
      }
      local_c8 = statbuf.st_size;
      if (ef < 0) {
LAB_00113d17:
        ef = uVar4 - 1;
        iVar13 = (int)local_100;
      }
      else {
        iVar13 = (int)local_100;
        if ((int)uVar4 <= ef) {
          local_f4 = iVar9;
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x441,"%s: End frame (%d) beyond file size (%d), will truncate\n",file,
                  (ulong)(uint)ef,uVar4);
          iVar9 = local_f4;
          goto LAB_00113d17;
        }
      }
      iVar11 = uVar4 - 1;
      iVar8 = sf - iVar13;
      iVar13 = ef + iVar13;
      iVar12 = 0;
      if (0 < iVar8) {
        iVar12 = iVar8;
      }
      uVar10 = iVar8 >> 0x1f & -iVar8;
      uVar6 = (ulong)((iVar13 - uVar4) + 1);
      if (iVar13 < (int)uVar4) {
        uVar6 = 0;
        iVar11 = iVar13;
      }
      nfr = (iVar11 - iVar12) + 1;
      if ((int)uVar4 <= (int)nfr) {
        nfr = uVar4;
      }
      if ((maxfr < 1) || (uVar5 = nfr + uVar10 + (int)uVar6, (int)uVar5 <= maxfr)) {
        iVar13 = nfr + uVar10 + (int)uVar6;
        local_e0 = (ulong)uVar10;
        local_d0 = uVar6;
        if (out_mfc == (mfcc_t ***)0x0) {
LAB_00113f2f:
          fclose(local_108);
          return iVar13;
        }
        local_f0 = CONCAT44(local_f0._4_4_,iVar12);
        local_e8 = (size_t)cepsize;
        local_f4 = iVar9;
        local_d8 = (ulong)(nfr + uVar10);
        local_100 = (mfcc_t **)
                    __ckd_calloc_2d__((long)iVar13,local_e8,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                      ,0x462);
        if (0 < iVar8) {
          fseek(local_108,(long)((int)local_f0 * cepsize) << 2,1);
        }
        n_float32 = nfr * cepsize;
        local_f0 = local_e0 & 0xffffffff;
        pointer = local_100[local_f0];
        iVar3 = fread_retry(pointer,4,n_float32,(FILE *)local_108);
        if (iVar3 == n_float32) {
          mfc = local_100 + local_f0;
          if (local_f4 != (int)local_c8) {
            for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
              mVar1 = pointer[lVar7];
              pointer[lVar7] =
                   (mfcc_t)((uint)mVar1 >> 0x18 | ((uint)mVar1 & 0xff0000) >> 8 |
                            ((uint)mVar1 & 0xff00) << 8 | (int)mVar1 << 0x18);
              iVar3 = n_float32;
            }
          }
          feat_cmn(fcb,mfc,nfr,1,1);
          feat_agc(fcb,mfc,nfr,1,1);
          uVar6 = local_d0;
          local_e8 = local_e8 << 2;
          uVar14 = 0;
          uVar15 = local_e0 & 0xffffffff;
          if ((int)local_e0 < 1) {
            uVar15 = uVar14;
          }
          for (; ppmVar2 = local_100, uVar15 != uVar14; uVar14 = uVar14 + 1) {
            memcpy(local_100[uVar14],*mfc,local_e8);
          }
          lVar7 = (long)(int)local_d8;
          uVar14 = 0;
          uVar15 = uVar6 & 0xffffffff;
          if ((int)uVar6 < 1) {
            uVar15 = uVar14;
          }
          for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
            memcpy(ppmVar2[lVar7 + uVar14],local_100[lVar7 + -1],local_e8);
          }
          *out_mfc = local_100;
          goto LAB_00113f2f;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x46c,"%s: fread(%dx%d) (MFC data) failed\n",file,(ulong)nfr,cepsize);
        ckd_free_2d(local_100);
        __stream = local_108;
        goto LAB_00113c9e;
      }
      fmt = "%s: Maximum output size(%d frames) < actual #frames(%d)\n";
      lVar7 = 0x45a;
      uVar6 = (ulong)(uint)maxfr;
    }
  }
  else {
    fmt = "%s: Header size field: %d(%08x); filesize: %d(%08x)\n";
    lVar7 = 0x41d;
    uVar5 = n_float32;
  }
LAB_00113c70:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,lVar7,fmt,file,uVar6,uVar5);
  __stream = local_108;
LAB_00113c9e:
  fclose(__stream);
  return -1;
}

Assistant:

static int32
feat_s2mfc_read_norm_pad(feat_t *fcb, char *file, int32 win,
            		 int32 sf, int32 ef,
            		 mfcc_t ***out_mfc,
            		 int32 maxfr,
            		 int32 cepsize)
{
    FILE *fp;
    int32 n_float32;
    float32 *float_feat;
    struct stat statbuf;
    int32 i, n, byterev;
    int32 start_pad, end_pad;
    mfcc_t **mfc;

    /* Initialize the output pointer to NULL, so that any attempts to
       free() it if we fail before allocating it will not segfault! */
    if (out_mfc)
        *out_mfc = NULL;
    E_INFO("Reading mfc file: '%s'[%d..%d]\n", file, sf, ef);
    if (ef >= 0 && ef <= sf) {
        E_ERROR("%s: End frame (%d) <= Start frame (%d)\n", file, ef, sf);
        return -1;
    }

    /* Find filesize; HACK!! To get around intermittent NFS failures, use stat_retry */
    if ((stat_retry(file, &statbuf) < 0)
        || ((fp = fopen(file, "rb")) == NULL)) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file);
        return -1;
    }

    /* Read #floats in header */
    if (fread_retry(&n_float32, sizeof(int32), 1, fp) != 1) {
        E_ERROR("%s: fread(#floats) failed\n", file);
        fclose(fp);
        return -1;
    }

    /* Check if n_float32 matches file size */
    byterev = 0;
    if ((int32) (n_float32 * sizeof(float32) + 4) != (int32) statbuf.st_size) { /* RAH, typecast both sides to remove compile warning */
        n = n_float32;
        SWAP_INT32(&n);

        if ((int32) (n * sizeof(float32) + 4) != (int32) (statbuf.st_size)) {   /* RAH, typecast both sides to remove compile warning */
            E_ERROR
                ("%s: Header size field: %d(%08x); filesize: %d(%08x)\n",
                 file, n_float32, n_float32, statbuf.st_size,
                 statbuf.st_size);
            fclose(fp);
            return -1;
        }

        n_float32 = n;
        byterev = 1;
    }
    if (n_float32 <= 0) {
        E_ERROR("%s: Header size field (#floats) = %d\n", file, n_float32);
        fclose(fp);
        return -1;
    }

    /* Convert n to #frames of input */
    n = n_float32 / cepsize;
    if (n * cepsize != n_float32) {
        E_ERROR("Header size field: %d; not multiple of %d\n", n_float32,
                cepsize);
        fclose(fp);
        return -1;
    }

    /* Check start and end frames */
    if (sf > 0) {
        if (sf >= n) {
            E_ERROR("%s: Start frame (%d) beyond file size (%d)\n", file,
                    sf, n);
            fclose(fp);
            return -1;
        }
    }
    if (ef < 0)
        ef = n-1;
    else if (ef >= n) {
        E_WARN("%s: End frame (%d) beyond file size (%d), will truncate\n",
               file, ef, n);
        ef = n-1;
    }

    /* Add window to start and end frames */
    sf -= win;
    ef += win;
    if (sf < 0) {
        start_pad = -sf;
        sf = 0;
    }
    else
        start_pad = 0;
    if (ef >= n) {
        end_pad = ef - n + 1;
        ef = n - 1;
    }
    else
        end_pad = 0;

    /* Limit n if indicated by [sf..ef] */
    if ((ef - sf + 1) < n)
        n = (ef - sf + 1);
    if (maxfr > 0 && n + start_pad + end_pad > maxfr) {
        E_ERROR("%s: Maximum output size(%d frames) < actual #frames(%d)\n",
                file, maxfr, n + start_pad + end_pad);
        fclose(fp);
        return -1;
    }

    /* If no output buffer was supplied, then skip the actual data reading. */
    if (out_mfc != NULL) {
        /* Position at desired start frame and read actual MFC data */
        mfc = (mfcc_t **)ckd_calloc_2d(n + start_pad + end_pad, cepsize, sizeof(mfcc_t));
        if (sf > 0)
            fseek(fp, sf * cepsize * sizeof(float32), SEEK_CUR);
        n_float32 = n * cepsize;
#ifdef FIXED_POINT
        float_feat = ckd_calloc(n_float32, sizeof(float32));
#else
        float_feat = mfc[start_pad];
#endif
        if (fread_retry(float_feat, sizeof(float32), n_float32, fp) != n_float32) {
            E_ERROR("%s: fread(%dx%d) (MFC data) failed\n", file, n, cepsize);
            ckd_free_2d(mfc);
            fclose(fp);
            return -1;
        }
        if (byterev) {
            for (i = 0; i < n_float32; i++) {
                SWAP_FLOAT32(&float_feat[i]);
            }
        }
#ifdef FIXED_POINT
        for (i = 0; i < n_float32; ++i) {
            mfc[start_pad][i] = FLOAT2MFCC(float_feat[i]);
        }
        ckd_free(float_feat);
#endif

        /* Normalize */
        feat_cmn(fcb, mfc + start_pad, n, 1, 1);
        feat_agc(fcb, mfc + start_pad, n, 1, 1);

        /* Replicate start and end frames if necessary. */
        for (i = 0; i < start_pad; ++i)
            memcpy(mfc[i], mfc[start_pad], cepsize * sizeof(mfcc_t));
        for (i = 0; i < end_pad; ++i)
            memcpy(mfc[start_pad + n + i], mfc[start_pad + n - 1],
                   cepsize * sizeof(mfcc_t));

        *out_mfc = mfc;
    }

    fclose(fp);
    return n + start_pad + end_pad;
}